

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20HM303D.cpp
# Opt level: O3

bool __thiscall RTIMUGD20HM303D::setCompassCTRL5(RTIMUGD20HM303D *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20HM303DCompassSampleRate;
  if (uVar1 < 6) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelCompassSlaveAddr,'$',
                               (char)uVar1 << 2,"Failed to set LSM303D CTRL5");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM303D compass sample rate code %d\n");
  return false;
}

Assistant:

bool RTIMUGD20HM303D::setCompassCTRL5()
{
    unsigned char ctrl5;

    if ((m_settings->m_GD20HM303DCompassSampleRate < 0) || (m_settings->m_GD20HM303DCompassSampleRate > 5)) {
        HAL_ERROR1("Illegal LSM303D compass sample rate code %d\n", m_settings->m_GD20HM303DCompassSampleRate);
        return false;
    }

    ctrl5 = (m_settings->m_GD20HM303DCompassSampleRate << 2);

#ifdef GD20HM303D_CACHE_MODE
    //  enable fifo

    ctrl5 |= 0x40;
#endif

    return m_settings->HALWrite(m_accelCompassSlaveAddr,  LSM303D_CTRL5, ctrl5, "Failed to set LSM303D CTRL5");
}